

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSlowShrinking.cpp
# Opt level: O2

bool __thiscall
PropTestSlowFunction::check(PropTestSlowFunction *this,vector<int,_std::allocator<int>_> *v)

{
  pointer piVar1;
  ostream *poVar2;
  bool bVar3;
  duration<long,_std::ratio<1L,_1L>_> local_18;
  
  if (((this->shrinking)._M_base._M_i & 1U) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Sleeping...");
    std::endl<char,std::char_traits<char>>(poVar2);
    local_18.__r = 1;
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>(&local_18);
  }
  piVar1 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  bVar3 = true;
  if ((0xc < (ulong)((long)(v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)piVar1)) &&
     (piVar1[3] % 5 == 1)) {
    LOCK();
    (this->shrinking)._M_base._M_i = true;
    UNLOCK();
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool check(const std::vector<int>& v) const override {
    if (shrinking) {
      std::cout << "Sleeping..." << std::endl;
      std::this_thread::sleep_for(std::chrono::seconds(1));
    }

    if (v.size() >= 4 && (v[3] % 5) == 1) {
      shrinking = true;
      return false;
    }
    return true;
  }